

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O0

bool draco::parser::ParseUnsignedInt(DecoderBuffer *buffer,uint32_t *value)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int *in_RSI;
  DecoderBuffer *in_RDI;
  bool have_digits;
  char ch;
  uint32_t v;
  char local_1d;
  int local_1c;
  int *local_18;
  DecoderBuffer *local_10;
  
  local_1c = 0;
  bVar2 = false;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    bVar3 = DecoderBuffer::Peek<char>(local_10,&local_1d);
    bVar1 = false;
    if ((bVar3) && (bVar1 = false, '/' < local_1d)) {
      bVar1 = local_1d < ':';
    }
    if (!bVar1) break;
    local_1c = local_1d + -0x30 + local_1c * 10;
    DecoderBuffer::Advance(local_10,1);
    bVar2 = true;
  }
  if (bVar2) {
    *local_18 = local_1c;
  }
  return bVar2;
}

Assistant:

bool ParseUnsignedInt(DecoderBuffer *buffer, uint32_t *value) {
  // Parse the number until we run out of digits.
  uint32_t v = 0;
  char ch;
  bool have_digits = false;
  while (buffer->Peek(&ch) && ch >= '0' && ch <= '9') {
    v *= 10;
    v += (ch - '0');
    buffer->Advance(1);
    have_digits = true;
  }
  if (!have_digits) {
    return false;
  }
  *value = v;
  return true;
}